

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_scale_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d40e5::ResizeAndExtendTest::RunTest
          (ResizeAndExtendTest *this,InterpFilter filter_type)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint phase_scaler_00;
  int iVar5;
  byte in_SIL;
  long in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int dst_height;
  int dst_width;
  int sf_down;
  int sf_down_idx;
  int sf_up;
  int sf_up_idx;
  int src_width;
  int w;
  int src_height;
  int h;
  int phase_scaler;
  int dst_border;
  int border;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  int iVar6;
  int in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffef8;
  int iVar7;
  int in_stack_fffffffffffffefc;
  ResizeAndExtendTest *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  AssertionResult *in_stack_ffffffffffffff10;
  Type in_stack_ffffffffffffff1c;
  HasNewFatalFailureHelper *in_stack_ffffffffffffff20;
  AssertionResult local_a8;
  Message *in_stack_ffffffffffffff68;
  AssertHelper *in_stack_ffffffffffffff70;
  AssertionResult local_88 [2];
  int local_68;
  int in_stack_ffffffffffffffbc;
  int iVar8;
  int iVar9;
  int iVar10;
  int local_24;
  int local_1c;
  uint local_18;
  int local_10;
  
  local_10 = 0;
  do {
    if (1 < local_10) {
      return;
    }
    for (local_18 = 0; (int)local_18 < 0x10; local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < 0x16; local_1c = local_1c + 1) {
        uVar1 = RunTest::kSizesToTest[local_1c];
        for (local_24 = 0; local_24 < 0x16; local_24 = local_24 + 1) {
          uVar2 = RunTest::kSizesToTest[local_24];
          for (iVar10 = 0; iVar10 < 4; iVar10 = iVar10 + 1) {
            iVar9 = RunTest::kScaleFactors[iVar10];
            for (iVar8 = 0; iVar8 < 4; iVar8 = iVar8 + 1) {
              iVar6 = RunTest::kScaleFactors[iVar8];
              uVar4 = (int)(uVar2 * iVar9) / iVar6;
              phase_scaler_00 = (int)(uVar1 * iVar9) / iVar6;
              if (((((iVar6 != 4) || (iVar9 != 3)) && ((iVar9 != iVar6 || (iVar9 == 1)))) &&
                  ((((uVar4 != 0 && (phase_scaler_00 != 0)) && ((uVar4 & 1) == 0)) &&
                   (((phase_scaler_00 & 1) == 0 && ((int)uVar2 <= (int)(uVar4 * 4))))))) &&
                 ((int)uVar1 <= (int)(phase_scaler_00 * 4))) {
                bVar3 = testing::internal::AlwaysTrue();
                if (!bVar3) {
LAB_003dd4c6:
                  iVar10 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
                  testing::Message::Message((Message *)in_stack_ffffffffffffff20);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                             &in_stack_ffffffffffffff10->success_,iVar10,
                             (char *)in_stack_ffffffffffffff00);
                  testing::internal::AssertHelper::operator=
                            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
                  testing::Message::~Message((Message *)0x3dd52b);
                  return;
                }
                testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                          (in_stack_ffffffffffffff20);
                bVar3 = testing::internal::AlwaysTrue();
                iVar7 = iVar9;
                if (bVar3) {
                  ResetResizeImages(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                                    in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                                    in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
                  iVar7 = iVar9;
                }
                bVar3 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                                  ((HasNewFatalFailureHelper *)&stack0xffffffffffffffa8);
                if (bVar3) {
                  local_68 = 0x14;
                }
                else {
                  local_68 = 0;
                }
                testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                          ((HasNewFatalFailureHelper *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
                if (local_68 != 0) goto LAB_003dd4c6;
                av1_resize_and_extend_frame_c
                          ((YV12_BUFFER_CONFIG *)CONCAT44(iVar10,iVar7),
                           (YV12_BUFFER_CONFIG *)CONCAT44(iVar8,iVar6),(InterpFilter)(uVar4 >> 0x18)
                           ,phase_scaler_00,in_stack_ffffffffffffffbc);
                (**(code **)(in_RDI + 0x290))(in_RDI + 0x20,in_RDI + 0x1c0,in_SIL,local_18,1);
                iVar5 = memcmp(*(void **)(in_RDI + 0x230),*(void **)(in_RDI + 0x160),
                               *(size_t *)(in_RDI + 0x178));
                iVar9 = iVar7;
                if (iVar5 != 0) {
                  printf("filter_type = %d, phase_scaler = %d, src_width = %4d, src_height = %4d, dst_width = %4d, dst_height = %4d, scale factor = %d:%d\n"
                         ,(ulong)in_SIL,(ulong)local_18,(ulong)uVar2,(ulong)uVar1,(ulong)uVar4,
                         phase_scaler_00);
                  PrintDiff((ResizeAndExtendTest *)CONCAT44(in_stack_fffffffffffffef4,iVar6));
                  in_stack_fffffffffffffef0 = iVar6;
                  in_stack_fffffffffffffef8 = iVar7;
                }
                testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                          (in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                           (unsigned_long *)
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           (unsigned_long *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
                bVar3 = testing::AssertionResult::operator_cast_to_bool(local_88);
                if (!bVar3) {
                  testing::Message::Message((Message *)in_stack_ffffffffffffff20);
                  in_stack_ffffffffffffff20 =
                       (HasNewFatalFailureHelper *)
                       testing::AssertionResult::failure_message((AssertionResult *)0x3dd6eb);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                             &in_stack_ffffffffffffff10->success_,
                             (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                             (char *)in_stack_ffffffffffffff00);
                  testing::internal::AssertHelper::operator=
                            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
                  testing::Message::~Message((Message *)0x3dd748);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dd79d);
                memcmp(*(void **)(in_RDI + 0x160),*(void **)(in_RDI + 0x230),
                       *(size_t *)(in_RDI + 0x178));
                in_stack_ffffffffffffff10 = &local_a8;
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          (in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                           (int *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
                bVar3 = testing::AssertionResult::operator_cast_to_bool(in_stack_ffffffffffffff10);
                in_stack_ffffffffffffff1c = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff1c);
                if (!bVar3) {
                  testing::Message::Message((Message *)in_stack_ffffffffffffff20);
                  in_stack_ffffffffffffff08 =
                       testing::AssertionResult::failure_message((AssertionResult *)0x3dd84f);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                             &in_stack_ffffffffffffff10->success_,
                             (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                             (char *)in_stack_ffffffffffffff00);
                  testing::internal::AssertHelper::operator=
                            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
                  testing::Message::~Message((Message *)0x3dd89d);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dd8e9);
                DeallocResizeImages((ResizeAndExtendTest *)
                                    CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
              }
            }
          }
        }
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

void RunTest(InterpFilter filter_type) {
    static const int kNumSizesToTest = 22;
    static const int kNumScaleFactorsToTest = 4;
    static const int kNumDstBordersToTest = 2;
    static const int kSizesToTest[] = { 1,  2,  3,  4,  6,   8,  10, 12,
                                        14, 16, 18, 20, 22,  24, 26, 28,
                                        30, 32, 34, 68, 128, 134 };
    static const int kScaleFactors[] = { 1, 2, 3, 4 };
    static const int kDstBorders[] = { 0, AOM_BORDER_IN_PIXELS };
    for (int border = 0; border < kNumDstBordersToTest; ++border) {
      const int dst_border = kDstBorders[border];
      for (int phase_scaler = 0; phase_scaler < 16; ++phase_scaler) {
        for (int h = 0; h < kNumSizesToTest; ++h) {
          const int src_height = kSizesToTest[h];
          for (int w = 0; w < kNumSizesToTest; ++w) {
            const int src_width = kSizesToTest[w];
            for (int sf_up_idx = 0; sf_up_idx < kNumScaleFactorsToTest;
                 ++sf_up_idx) {
              const int sf_up = kScaleFactors[sf_up_idx];
              for (int sf_down_idx = 0; sf_down_idx < kNumScaleFactorsToTest;
                   ++sf_down_idx) {
                const int sf_down = kScaleFactors[sf_down_idx];
                const int dst_width = src_width * sf_up / sf_down;
                const int dst_height = src_height * sf_up / sf_down;
                // TODO: bug aomedia:363916152 - Enable unit tests for 4 to 3
                // scaling when Neon and SSSE3 implementation of
                // av1_resize_and_extend_frame do not differ from scalar version
                if (sf_down == 4 && sf_up == 3) {
                  continue;
                }

                if (sf_up == sf_down && sf_up != 1) {
                  continue;
                }
                // I420 frame width and height must be even.
                if (!dst_width || !dst_height || dst_width & 1 ||
                    dst_height & 1) {
                  continue;
                }
                // aom_convolve8_c() has restriction on the step which cannot
                // exceed 64 (ratio 1 to 4).
                if (src_width > 4 * dst_width || src_height > 4 * dst_height) {
                  continue;
                }
                ASSERT_NO_FATAL_FAILURE(ResetResizeImages(
                    src_width, src_height, dst_width, dst_height, dst_border));

                av1_resize_and_extend_frame_c(&img_, &ref_img_, filter_type,
                                              phase_scaler, 1);
                resize_fn_(&img_, &dst_img_, filter_type, phase_scaler, 1);

                if (memcmp(dst_img_.buffer_alloc, ref_img_.buffer_alloc,
                           ref_img_.frame_size)) {
                  printf(
                      "filter_type = %d, phase_scaler = %d, src_width = %4d, "
                      "src_height = %4d, dst_width = %4d, dst_height = %4d, "
                      "scale factor = %d:%d\n",
                      filter_type, phase_scaler, src_width, src_height,
                      dst_width, dst_height, sf_down, sf_up);
                  PrintDiff();
                }

                EXPECT_EQ(ref_img_.frame_size, dst_img_.frame_size);
                EXPECT_EQ(0,
                          memcmp(ref_img_.buffer_alloc, dst_img_.buffer_alloc,
                                 ref_img_.frame_size));

                DeallocResizeImages();
              }
            }
          }
        }
      }
    }
  }